

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryNumericDivideWrapper,duckdb::ModuloOperator,bool,false,true>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = *rdata;
      iVar7 = 0;
      do {
        lVar4 = BinaryNumericDivideWrapper::Operation<bool,duckdb::ModuloOperator,long,long,long>
                          (fun,ldata[iVar7],lVar5,mask,iVar7);
        result_data[iVar7] = lVar4;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    iVar7 = 0;
    local_60 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = iVar7 + 0x40;
        if (count <= iVar7 + 0x40) {
          uVar8 = count;
        }
LAB_014aa913:
        uVar3 = iVar7;
        if (iVar7 < uVar8) {
          lVar5 = *rdata;
          do {
            lVar4 = BinaryNumericDivideWrapper::
                    Operation<bool,duckdb::ModuloOperator,long,long,long>
                              (fun,ldata[iVar7],lVar5,mask,iVar7);
            result_data[iVar7] = lVar4;
            iVar7 = iVar7 + 1;
            uVar3 = uVar8;
          } while (uVar8 != iVar7);
        }
      }
      else {
        uVar2 = puVar1[local_60];
        uVar8 = iVar7 + 0x40;
        if (count <= iVar7 + 0x40) {
          uVar8 = count;
        }
        uVar3 = uVar8;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_014aa913;
          uVar3 = iVar7;
          if (iVar7 < uVar8) {
            uVar6 = 0;
            do {
              if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
                lVar5 = BinaryNumericDivideWrapper::
                        Operation<bool,duckdb::ModuloOperator,long,long,long>
                                  (fun,ldata[iVar7 + uVar6],*rdata,mask,uVar6 + iVar7);
                result_data[iVar7 + uVar6] = lVar5;
              }
              uVar6 = uVar6 + 1;
              uVar3 = uVar8;
            } while (uVar8 - iVar7 != uVar6);
          }
        }
      }
      iVar7 = uVar3;
      local_60 = local_60 + 1;
    } while (local_60 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}